

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.h
# Opt level: O0

void __thiscall
slang::ast::ASTContext::ASTContext
          (ASTContext *this,Scope *scope,LookupLocation lookupLocation,
          bitmask<slang::ast::ASTFlags> flags)

{
  SymbolIndex SVar1;
  Scope *pSVar2;
  Scope *local_38;
  Scope *local_30;
  Scope *scope_local;
  ASTContext *this_local;
  bitmask<slang::ast::ASTFlags> flags_local;
  LookupLocation lookupLocation_local;
  
  flags_local.m_bits = (underlying_type)lookupLocation.scope;
  local_38 = scope;
  local_30 = scope;
  scope_local = (Scope *)this;
  this_local = (ASTContext *)flags.m_bits;
  not_null<slang::ast::Scope_const*>::not_null<slang::ast::Scope_const*,void>
            ((not_null<slang::ast::Scope_const*> *)this,&local_38);
  SVar1 = LookupLocation::getIndex((LookupLocation *)&flags_local);
  this->lookupIndex = SVar1;
  (this->flags).m_bits = (underlying_type)this_local;
  this->instanceOrProc = (Symbol *)0x0;
  this->firstTempVar = (TempVarSymbol *)0x0;
  this->randomizeDetails = (RandomizeDetails *)0x0;
  this->assertionInstance = (AssertionInstanceDetails *)0x0;
  pSVar2 = LookupLocation::getScope((LookupLocation *)&flags_local);
  if (pSVar2 != (Scope *)0x0) {
    pSVar2 = LookupLocation::getScope((LookupLocation *)&flags_local);
    if (pSVar2 != local_30) {
      assert::assertFailed
                ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                 ,0x119,
                 "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                );
    }
  }
  return;
}

Assistant:

ASTContext(const Scope& scope, LookupLocation lookupLocation,
               bitmask<ASTFlags> flags = ASTFlags::None) :
        scope(&scope),
        lookupIndex(lookupLocation.getIndex()), flags(flags) {
        ASSERT(!lookupLocation.getScope() || lookupLocation.getScope() == &scope);
    }